

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_56ae1867 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c;
  int iVar1;
  int iVar2;
  pointer piVar3;
  int *piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  bool bVar6;
  HighsInt HVar7;
  HighsInt HVar8;
  ulong uVar9;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HighsSymmetry_cpp:1470:47)>
  __cmp;
  ulong uVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int *piVar18;
  _DistanceType __len;
  int *local_88;
  int local_74;
  
  uVar9 = (long)end._M_current - (long)begin._M_current >> 2;
  if ((long)uVar9 < 0x18) {
    if (!leftmost) {
LAB_0030038c:
      if (begin._M_current == end._M_current) {
        return;
      }
      while (piVar12 = begin._M_current, begin._M_current = piVar12 + 1,
            begin._M_current != end._M_current) {
        iVar1 = piVar12[1];
        iVar2 = *piVar12;
        HVar7 = HighsDisjointSets<false>::getSet
                          (&(comp.componentData)->components,
                           ((comp.componentData)->firstUnfixed).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar1]);
        HVar8 = HighsDisjointSets<false>::getSet
                          (&(comp.componentData)->components,
                           ((comp.componentData)->firstUnfixed).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar2]);
        if ((HVar7 < HVar8) ||
           ((HVar7 <= HVar8 &&
            (piVar3 = ((comp.componentData)->numUnfixed).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start, piVar3[iVar1] < piVar3[iVar2])))) {
          iVar1 = *begin._M_current;
          do {
            do {
              local_88 = piVar12;
              local_88[1] = *local_88;
              iVar2 = local_88[-1];
              HVar7 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar1]);
              HVar8 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2]);
              piVar12 = local_88 + -1;
            } while (HVar7 < HVar8);
          } while ((HVar7 <= HVar8) &&
                  (piVar3 = ((comp.componentData)->numUnfixed).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2]));
          *local_88 = iVar1;
        }
      }
      return;
    }
  }
  else {
    c._M_current = end._M_current + -1;
    lVar15 = (long)end._M_current - (long)begin._M_current;
    local_74 = bad_allowed;
    do {
      uVar16 = uVar9 >> 1;
      _Var14._M_current = begin._M_current + uVar16;
      if (uVar9 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  (_Var14,begin,c,comp);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  (begin,_Var14,c,comp);
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (begin._M_current + 1),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (begin._M_current + (uVar16 - 1)),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (end._M_current + -2),comp);
        piVar12 = begin._M_current + uVar16;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (begin._M_current + 2),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar12 + 1),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (end._M_current + -3),comp);
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (begin._M_current + (uVar16 - 1)),_Var14,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar12 + 1),
                   comp);
        iVar1 = *begin._M_current;
        *begin._M_current = *piVar12;
        *piVar12 = iVar1;
      }
      if ((leftmost & 1U) == 0) {
        iVar1 = begin._M_current[-1];
        iVar2 = *begin._M_current;
        HVar7 = HighsDisjointSets<false>::getSet
                          (&(comp.componentData)->components,
                           ((comp.componentData)->firstUnfixed).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar1]);
        HVar8 = HighsDisjointSets<false>::getSet
                          (&(comp.componentData)->components,
                           ((comp.componentData)->firstUnfixed).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar2]);
        if ((HVar7 < HVar8) ||
           ((HVar7 <= HVar8 &&
            (piVar3 = ((comp.componentData)->numUnfixed).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start, piVar3[iVar1] < piVar3[iVar2])))) goto LAB_002ffd7a;
        iVar1 = *begin._M_current;
        lVar15 = 0;
        while( true ) {
          iVar2 = *(c._M_current + lVar15);
          HVar7 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar1]);
          HVar8 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2]);
          if ((HVar8 <= HVar7) &&
             ((HVar8 < HVar7 ||
              (piVar3 = ((comp.componentData)->numUnfixed).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start, piVar3[iVar2] <= piVar3[iVar1])))) break;
          lVar15 = lVar15 + -4;
        }
        piVar11 = c._M_current + lVar15;
        piVar12 = begin._M_current + 1;
        if (lVar15 == 0) {
          while (piVar13 = piVar12 + -1, piVar12 + -1 < piVar11) {
            iVar2 = *piVar12;
            HVar7 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            piVar13 = piVar12;
            if ((HVar7 < HVar8) ||
               ((piVar12 = piVar12 + 1, HVar7 <= HVar8 &&
                (piVar3 = ((comp.componentData)->numUnfixed).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2])))) break;
          }
        }
        else {
          do {
            piVar13 = piVar12;
            iVar2 = *piVar13;
            HVar7 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            if (HVar7 < HVar8) break;
            piVar12 = piVar13 + 1;
          } while ((HVar8 < HVar7) ||
                  (piVar3 = ((comp.componentData)->numUnfixed).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, piVar3[iVar2] <= piVar3[iVar1]));
        }
LAB_0030034c:
        if (piVar13 < piVar11) {
          iVar2 = *piVar13;
          *piVar13 = *piVar11;
          *piVar11 = iVar2;
          do {
            do {
              piVar11 = piVar11 + -1;
              iVar2 = *piVar11;
              HVar7 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar1]);
              HVar8 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2]);
            } while (HVar7 < HVar8);
          } while ((HVar7 <= HVar8) &&
                  (piVar3 = ((comp.componentData)->numUnfixed).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2]));
          piVar12 = piVar13 + 1;
          do {
            piVar13 = piVar12;
            iVar2 = *piVar13;
            HVar7 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            if (HVar7 < HVar8) break;
            piVar12 = piVar13 + 1;
          } while ((HVar8 < HVar7) ||
                  (piVar3 = ((comp.componentData)->numUnfixed).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, piVar3[iVar2] <= piVar3[iVar1]));
          goto LAB_0030034c;
        }
        *begin._M_current = *piVar11;
        *piVar11 = iVar1;
        begin._M_current = piVar11 + 1;
        lVar17 = (long)end._M_current - (long)begin._M_current;
        uVar9 = lVar17 >> 2;
      }
      else {
LAB_002ffd7a:
        iVar1 = *begin._M_current;
        lVar17 = 0;
        _Var14._M_current = begin._M_current;
        while( true ) {
          piVar12 = _Var14._M_current + 1;
          iVar2 = *piVar12;
          HVar7 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2]);
          HVar8 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar1]);
          if ((HVar8 <= HVar7) &&
             ((HVar8 < HVar7 ||
              (piVar3 = ((comp.componentData)->numUnfixed).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start, piVar3[iVar1] <= piVar3[iVar2])))) break;
          lVar17 = lVar17 + -4;
          _Var14._M_current = piVar12;
        }
        _Var5._M_current = c._M_current;
        if (lVar17 == 0) {
          while (piVar13 = _Var5._M_current, piVar11 = piVar13 + 1, piVar12 < piVar13 + 1) {
            iVar2 = *piVar13;
            HVar7 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            piVar11 = piVar13;
            if ((HVar7 < HVar8) ||
               ((_Var5._M_current = piVar13 + -1, HVar7 <= HVar8 &&
                (piVar3 = ((comp.componentData)->numUnfixed).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start, piVar3[iVar2] < piVar3[iVar1])))) break;
          }
        }
        else {
          do {
            piVar11 = _Var5._M_current;
            iVar2 = *piVar11;
            HVar7 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            if (HVar7 < HVar8) break;
            _Var5._M_current = piVar11 + -1;
          } while ((HVar8 < HVar7) ||
                  (piVar3 = ((comp.componentData)->numUnfixed).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, piVar3[iVar1] <= piVar3[iVar2]));
        }
        piVar13 = piVar12;
        piVar18 = piVar11;
        if (piVar12 < piVar11) {
          do {
            iVar2 = *piVar13;
            *piVar13 = *piVar18;
            *piVar18 = iVar2;
            do {
              do {
                _Var14._M_current = piVar13;
                piVar13 = _Var14._M_current + 1;
                iVar2 = *piVar13;
                HVar7 = HighsDisjointSets<false>::getSet
                                  (&(comp.componentData)->components,
                                   ((comp.componentData)->firstUnfixed).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar2]);
                HVar8 = HighsDisjointSets<false>::getSet
                                  (&(comp.componentData)->components,
                                   ((comp.componentData)->firstUnfixed).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar1]);
              } while (HVar7 < HVar8);
            } while ((HVar7 <= HVar8) &&
                    (piVar3 = ((comp.componentData)->numUnfixed).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, piVar3[iVar2] < piVar3[iVar1]));
            piVar4 = piVar18 + -1;
            do {
              piVar18 = piVar4;
              iVar2 = *piVar18;
              HVar7 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2]);
              HVar8 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar1]);
              if (HVar7 < HVar8) break;
              piVar4 = piVar18 + -1;
            } while ((HVar8 < HVar7) ||
                    (piVar3 = ((comp.componentData)->numUnfixed).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, piVar3[iVar1] <= piVar3[iVar2]));
          } while (piVar13 < piVar18);
        }
        *begin._M_current = *_Var14._M_current;
        *_Var14._M_current = iVar1;
        uVar16 = (long)_Var14._M_current - (long)begin._M_current >> 2;
        _Var5._M_current = _Var14._M_current + 1;
        lVar17 = (long)end._M_current - (long)_Var5._M_current;
        uVar10 = lVar17 >> 2;
        if (((long)uVar16 < (long)(uVar9 >> 3)) || ((long)uVar10 < (long)(uVar9 >> 3))) {
          local_74 = local_74 + -1;
          if (local_74 == 0) {
            uVar16 = uVar9 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>>
                        (begin,uVar16,uVar9,begin._M_current[uVar16],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HighsSymmetry_cpp:1470:47)>
                          )comp.componentData);
              bVar6 = uVar16 != 0;
              uVar16 = uVar16 - 1;
            } while (bVar6);
            if (lVar15 < 5) {
              return;
            }
            lVar15 = (long)end._M_current - (long)begin._M_current;
            do {
              end._M_current = end._M_current + -1;
              iVar1 = *end._M_current;
              *end._M_current = *begin._M_current;
              lVar15 = lVar15 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>>
                        (begin,0,lVar15 >> 2,iVar1,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HighsSymmetry_cpp:1470:47)>
                          )comp.componentData);
            } while (4 < lVar15);
            return;
          }
          if (0x17 < (long)uVar16) {
            uVar9 = uVar16 & 0xfffffffffffffffc;
            iVar1 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar9);
            *(begin._M_current + uVar9) = iVar1;
            iVar1 = _Var14._M_current[-1];
            _Var14._M_current[-1] = *(_Var14._M_current - uVar9);
            *(_Var14._M_current - uVar9) = iVar1;
            if (0x80 < uVar16) {
              uVar16 = uVar16 >> 2;
              iVar1 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar16 + 1];
              begin._M_current[uVar16 + 1] = iVar1;
              iVar1 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar16 + 2];
              begin._M_current[uVar16 + 2] = iVar1;
              iVar1 = _Var14._M_current[-2];
              _Var14._M_current[-2] = _Var14._M_current[~uVar16];
              _Var14._M_current[~uVar16] = iVar1;
              iVar1 = _Var14._M_current[-3];
              _Var14._M_current[-3] = _Var14._M_current[-2 - uVar16];
              _Var14._M_current[-2 - uVar16] = iVar1;
            }
          }
          if (0x17 < (long)uVar10) {
            iVar1 = _Var14._M_current[1];
            uVar9 = uVar10 & 0xfffffffffffffffc;
            _Var14._M_current[1] = *(uVar9 + 4 + _Var14._M_current);
            *(uVar9 + 4 + _Var14._M_current) = iVar1;
            iVar1 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar9);
            *(end._M_current - uVar9) = iVar1;
            if (0x80 < uVar10) {
              uVar9 = uVar10 >> 2;
              iVar1 = _Var14._M_current[2];
              _Var14._M_current[2] = _Var14._M_current[uVar9 + 2];
              _Var14._M_current[uVar9 + 2] = iVar1;
              iVar1 = _Var14._M_current[3];
              _Var14._M_current[3] = _Var14._M_current[uVar9 + 3];
              _Var14._M_current[uVar9 + 3] = iVar1;
              iVar1 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar9];
              end._M_current[~uVar9] = iVar1;
              iVar1 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar9];
              end._M_current[-2 - uVar9] = iVar1;
            }
          }
        }
        else if (((piVar11 <= piVar12) &&
                 (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                                    (begin,_Var14,comp), bVar6)) &&
                (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                                   (_Var5,end,comp), bVar6)) {
          return;
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1,false>
                  (begin,_Var14,comp,local_74,(bool)(leftmost & 1));
        leftmost = false;
        uVar9 = uVar10;
        begin._M_current = _Var5._M_current;
      }
      lVar15 = lVar17;
    } while (0x17 < (long)uVar9);
    if ((leftmost & 1U) == 0) goto LAB_0030038c;
  }
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    local_88 = (int *)0x0;
    piVar12 = begin._M_current + 1;
    piVar11 = begin._M_current;
    do {
      piVar13 = piVar12;
      iVar1 = piVar11[1];
      iVar2 = *piVar11;
      HVar7 = HighsDisjointSets<false>::getSet
                        (&(comp.componentData)->components,
                         ((comp.componentData)->firstUnfixed).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      HVar8 = HighsDisjointSets<false>::getSet
                        (&(comp.componentData)->components,
                         ((comp.componentData)->firstUnfixed).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2]);
      if ((HVar7 < HVar8) ||
         ((HVar7 <= HVar8 &&
          (piVar3 = ((comp.componentData)->numUnfixed).super__Vector_base<int,_std::allocator<int>_>
                    ._M_impl.super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2])))) {
        iVar1 = piVar11[1];
        piVar11[1] = *piVar11;
        piVar12 = begin._M_current;
        if (piVar13 + -1 != begin._M_current) {
          piVar11 = local_88;
          do {
            iVar2 = *(begin._M_current + (long)piVar11 + -4);
            HVar7 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            if ((HVar8 <= HVar7) &&
               ((HVar8 < HVar7 ||
                (piVar3 = ((comp.componentData)->numUnfixed).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start, piVar3[iVar2] <= piVar3[iVar1])))) {
              piVar12 = (long)piVar11 + begin._M_current;
              break;
            }
            *(undefined4 *)((long)begin._M_current + (long)piVar11) =
                 *(undefined4 *)((long)begin._M_current + (long)piVar11 + -4);
            piVar11 = (int *)((long)piVar11 + -4);
          } while (piVar11 != (int *)0x0);
        }
        *piVar12 = iVar1;
      }
      local_88 = (int *)((long)local_88 + 4);
      piVar12 = piVar13 + 1;
      piVar11 = piVar13;
    } while (piVar13 + 1 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }